

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O1

base_learner * bs_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  int iVar2;
  bs *dat;
  option_group_definition *this;
  vector<double,_std::allocator<double>_> *this_00;
  base_learner *l;
  single_learner *base;
  learner<bs,_example> *plVar3;
  size_t sVar4;
  string type_string;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  long local_390;
  _func_int ***local_388;
  _func_int **local_380;
  _func_int **local_378 [2];
  string local_368;
  option_group_definition local_348;
  long *local_310;
  long local_308;
  long local_300 [2];
  string local_2f0;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined2 local_2b8;
  undefined1 local_2b0 [112];
  bool local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [112];
  bool local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  typed_option<unsigned_int> local_d0;
  
  dat = calloc_or_throw<bs>(1);
  *(undefined8 *)dat = 0;
  dat->bs_type = 0;
  dat->lb = 0.0;
  dat->ub = 0.0;
  dat->pred_vec = (vector<double,_std::allocator<double>_> *)0x0;
  dat->all = (vw *)0x0;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0.field_2._M_allocated_capacity._0_4_ = 0x6e61656d;
  local_3b0._M_string_length = 4;
  local_3b0.field_2._M_local_buf[4] = '\0';
  local_2c0 = 0x61727473746f6f42;
  local_2b8 = 0x70;
  local_2c8 = 9;
  local_348.m_name._M_dataplus._M_p = (pointer)&local_348.m_name.field_2;
  local_2d0 = &local_2c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_348,&local_2c0,(long)&local_2b8 + 1);
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368.field_2._M_allocated_capacity = 0x61727473746f6f62;
  local_368.field_2._8_2_ = 0x70;
  local_368._M_string_length = 9;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_2b0,&local_368,&dat->B);
  local_240 = true;
  local_388 = local_378;
  local_210._0_8_ = (_func_int **)0x2f;
  local_388 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_388,(ulong)local_210);
  local_378[0] = (_func_int **)local_210._0_8_;
  builtin_strncpy((char *)((long)local_388 + 0x1f),"tance re",8);
  builtin_strncpy((char *)((long)local_388 + 0x27),"sampling",8);
  local_388[2] = (_func_int **)0x6e696c6e6f207962;
  local_388[3] = (_func_int **)0x74726f706d692065;
  *local_388 = (_func_int **)0x6f62207961772d6b;
  local_388[1] = (_func_int **)0x207061727473746f;
  local_380 = (_func_int **)local_210._0_8_;
  *(char *)((long)local_388 + local_210._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_2b0);
  this = VW::config::option_group_definition::add<unsigned_int>(&local_348,&local_d0);
  local_2f0.field_2._M_allocated_capacity._0_4_ = 0x745f7362;
  local_2f0.field_2._M_allocated_capacity._4_3_ = 0x657079;
  local_2f0._M_string_length = 7;
  local_2f0.field_2._M_local_buf[7] = '\0';
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_210,&local_2f0,&local_3b0);
  local_1a0 = true;
  local_390 = 0x1b;
  local_310 = local_300;
  local_310 = (long *)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_390);
  local_300[0] = local_390;
  builtin_strncpy((char *)((long)local_310 + 0xb),"type {me",8);
  builtin_strncpy((char *)((long)local_310 + 0x13),"an,vote}",8);
  *local_310 = 0x6974636964657270;
  local_310[1] = 0x2065707974206e6f;
  local_308 = local_390;
  *(char *)((long)local_310 + local_390) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_170,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_210);
  VW::config::option_group_definition::add<std::__cxx11::string>(this,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cdce0;
  if (local_170.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_170.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_310 != local_300) {
    operator_delete(local_310);
  }
  local_210._0_8_ = &PTR__typed_option_002cdce0;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cdd40;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  local_2b0._0_8_ = &PTR__typed_option_002cdd40;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_348);
  pp_Var1 = (_func_int **)(local_2b0 + 0x10);
  local_2b0._16_8_ = 0x61727473746f6f62;
  local_2b0._24_2_ = 0x70;
  local_2b0._8_8_ = (pointer)0x9;
  local_2b0._0_8_ = pp_Var1;
  iVar2 = (*options->_vptr_options_i[1])(options,local_2b0);
  if ((_func_int **)local_2b0._0_8_ != pp_Var1) {
    operator_delete((void *)local_2b0._0_8_);
  }
  if ((char)iVar2 == '\0') {
    plVar3 = (learner<bs,_example> *)0x0;
    goto LAB_001d4b5b;
  }
  dat->lb = -3.4028235e+38;
  dat->ub = 3.4028235e+38;
  local_2b0._8_8_ = (pointer)0x7;
  local_2b0._16_8_ = 0x657079745f7362;
  local_2b0._0_8_ = pp_Var1;
  iVar2 = (*options->_vptr_options_i[1])(options);
  if ((_func_int **)local_2b0._0_8_ != pp_Var1) {
    operator_delete((void *)local_2b0._0_8_);
  }
  if ((char)iVar2 == '\0') {
LAB_001d4ab7:
    sVar4 = 0;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_3b0);
    if (iVar2 == 0) goto LAB_001d4ab7;
    iVar2 = std::__cxx11::string::compare((char *)&local_3b0);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "warning: bs_type must be in {\'mean\',\'vote\'}; resetting to mean.",0x3f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      goto LAB_001d4ab7;
    }
    sVar4 = 1;
  }
  dat->bs_type = sVar4;
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dat->pred_vec = this_00;
  std::vector<double,_std::allocator<double>_>::reserve(this_00,(ulong)dat->B);
  dat->all = all;
  l = setup_base(options,all);
  base = LEARNER::as_singleline<char,char>(l);
  plVar3 = LEARNER::learner<bs,example>::init_learner<LEARNER::learner<char,example>>
                     (dat,base,predict_or_learn<true>,predict_or_learn<false>,(ulong)dat->B,
                      *(prediction_type_t *)(base + 0xd0));
  *(undefined8 *)(plVar3 + 0x58) = *(undefined8 *)(plVar3 + 0x18);
  *(code **)(plVar3 + 0x68) = finish_example;
  *(undefined8 *)(plVar3 + 0xb8) = *(undefined8 *)(plVar3 + 0x18);
  *(undefined8 *)(plVar3 + 0xc0) = *(undefined8 *)(plVar3 + 0x20);
  *(code **)(plVar3 + 200) = finish;
  dat = (bs *)0x0;
LAB_001d4b5b:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_348.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_name._M_dataplus._M_p != &local_348.m_name.field_2) {
    operator_delete(local_348.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if (dat != (bs *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar3;
}

Assistant:

base_learner* bs_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<bs>();
  std::string type_string("mean");
  option_group_definition new_options("Bootstrap");
  new_options.add(make_option("bootstrap", data->B).keep().help("k-way bootstrap by online importance resampling"))
      .add(make_option("bs_type", type_string).keep().help("prediction type {mean,vote}"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("bootstrap"))
    return nullptr;

  data->ub = FLT_MAX;
  data->lb = -FLT_MAX;

  if (options.was_supplied("bs_type"))
  {
    if (type_string.compare("mean") == 0)
      data->bs_type = BS_TYPE_MEAN;
    else if (type_string.compare("vote") == 0)
      data->bs_type = BS_TYPE_VOTE;
    else
    {
      std::cerr << "warning: bs_type must be in {'mean','vote'}; resetting to mean." << std::endl;
      data->bs_type = BS_TYPE_MEAN;
    }
  }
  else  // by default use mean
    data->bs_type = BS_TYPE_MEAN;

  data->pred_vec = new vector<double>();
  data->pred_vec->reserve(data->B);
  data->all = &all;

  learner<bs, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->B);
  l.set_finish_example(finish_example);
  l.set_finish(finish);

  return make_base(l);
}